

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp.hh
# Opt level: O3

size_t __thiscall
helix::nasdaq::moldudp_session<helix::nasdaq::nordic_itch_handler>::process_packet
          (moldudp_session<helix::nasdaq::nordic_itch_handler> *this,packet_view *packet)

{
  ushort uVar1;
  runtime_error *prVar2;
  long *plVar3;
  size_type *psVar4;
  uint uVar5;
  char *pcVar6;
  ushort *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  packet_view *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (packet->_len < 0x10) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"MoldUDP header is truncated","");
    std::runtime_error::runtime_error(prVar2,(string *)&local_f8);
    *(undefined ***)prVar2 = &PTR__runtime_error_00120c30;
    __cxa_throw(prVar2,&truncated_packet_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = packet->_buf;
  if (*(uint32_t *)(pcVar6 + 10) == this->_seq_num) {
    puVar7 = (ushort *)(pcVar6 + 0x10);
    if (*(short *)(pcVar6 + 0xe) != 0) {
      uVar5 = 0;
      local_d8 = packet;
      do {
        local_f8._M_dataplus._M_p = (pointer)(puVar7 + 1);
        local_f8._M_string_length = (size_type)*puVar7;
        nordic_itch_handler::process_packet(&this->_handler,(packet_view *)&local_f8);
        uVar1 = *puVar7;
        this->_seq_num = this->_seq_num + 1;
        puVar7 = (ushort *)((long)puVar7 + (ulong)uVar1 + 2);
        uVar5 = uVar5 + 1;
      } while (uVar5 < *(ushort *)(pcVar6 + 0xe));
      pcVar6 = local_d8->_buf;
    }
    return (long)puVar7 - (long)pcVar6;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"invalid sequence number: ","");
  std::__cxx11::to_string(&local_70,*(uint *)(pcVar6 + 10));
  std::operator+(&local_50,&local_d0,&local_70);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_8_ = plVar3[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::to_string(&local_90,this->_seq_num);
  std::operator+(&local_f8,&local_b0,&local_90);
  std::runtime_error::runtime_error(prVar2,(string *)&local_f8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t moldudp_session<Handler>::process_packet(const net::packet_view& packet)
{
    auto* p = packet.buf();
    if (packet.len() < sizeof(moldudp_header)) {
        throw truncated_packet_error("MoldUDP header is truncated");
    }
    auto* header = packet.cast<moldudp_header>();
    if (header->SequenceNumber != _seq_num) {
        throw std::runtime_error(std::string("invalid sequence number: ") + std::to_string(header->SequenceNumber) + ", expected: " + std::to_string(_seq_num));
    }
    p += sizeof(moldudp_header);

    for (int i = 0; i < header->MessageCount; i++) {
        auto* msg_block = reinterpret_cast<const moldudp_message_block*>(p);

        p += sizeof(moldudp_message_block);

        _handler.process_packet(net::packet_view{p, msg_block->MessageLength});

        p += msg_block->MessageLength;

        _seq_num++;
    }

    return p - packet.buf();
}